

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  int i;
  long lVar1;
  int k;
  long lVar2;
  Vector3D *pVVar3;
  long lVar4;
  Vector3D *pVVar5;
  double dVar6;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  lVar1 = 0;
  do {
    lVar4 = 0;
    pVVar3 = B->entries;
    do {
      dVar6 = 0.0;
      lVar2 = 0;
      pVVar5 = this->entries;
      do {
        dVar6 = dVar6 + ((Vector3D *)&pVVar5->x)->x * (&((Vector3D *)&pVVar3->x)->x)[lVar2];
        lVar2 = lVar2 + 1;
        pVVar5 = pVVar5 + 1;
      } while (lVar2 != 3);
      (&__return_storage_ptr__->entries[lVar4].x)[lVar1] = dVar6;
      lVar4 = lVar4 + 1;
      pVVar3 = pVVar3 + 1;
    } while (lVar4 != 3);
    lVar1 = lVar1 + 1;
    this = (Matrix3x3 *)&this->entries[0].y;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }